

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

TldAsKey * __thiscall
BinHash<TldAsKey>::DoInsert(BinHash<TldAsKey> *this,TldAsKey *key,bool need_alloc,bool *stored)

{
  uint uVar1;
  size_t __n;
  TldAsKey **ppTVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  uint32_t uVar6;
  TldAsKey *pTVar7;
  
  *stored = false;
  uVar1 = this->tableSize;
  if (uVar1 != 0 && key != (TldAsKey *)0x0) {
    if (key->hash == 0) {
      key->hash = 0xbabac001;
      if (key->tld_len != 0) {
        uVar6 = 0xbabac001;
        sVar5 = 0;
        do {
          uVar6 = (uint)key->tld[sVar5] + uVar6 * 0x65;
          key->hash = uVar6;
          sVar5 = sVar5 + 1;
        } while (key->tld_len != sVar5);
      }
    }
    uVar3 = (ulong)key->hash % (ulong)uVar1;
    pTVar7 = this->hashBin[uVar3];
    if (pTVar7 != (TldAsKey *)0x0) {
      __n = key->tld_len;
      do {
        if ((__n == pTVar7->tld_len) && (iVar4 = bcmp(key->tld,pTVar7->tld,__n), iVar4 == 0)) {
          if (pTVar7->max_name_parts < key->max_name_parts) {
            pTVar7->max_name_parts = key->max_name_parts;
          }
          pTVar7->count = pTVar7->count + key->count;
          *stored = false;
          return pTVar7;
        }
        pTVar7 = pTVar7->HashNext;
      } while (pTVar7 != (TldAsKey *)0x0);
    }
    if (need_alloc) {
      key = TldAsKey::CreateCopy(key);
    }
    if (key != (TldAsKey *)0x0) {
      ppTVar2 = this->hashBin;
      key->HashNext = ppTVar2[uVar3];
      ppTVar2[uVar3] = key;
      *stored = true;
      this->tableCount = this->tableCount + 1;
      return key;
    }
  }
  return (TldAsKey *)0x0;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }